

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_metrics * cram_new_metrics(void)

{
  cram_metrics *m;
  
  m = (cram_metrics *)calloc(1,0x78);
  if (m == (cram_metrics *)0x0) {
    m = (cram_metrics *)0x0;
  }
  else {
    m->trial = 2;
    m->next_trial = 0x32;
    m->method = 0;
    m->strat = 0;
    m->revised_method = 0;
  }
  return m;
}

Assistant:

cram_metrics *cram_new_metrics(void) {
    cram_metrics *m = calloc(1, sizeof(*m));
    if (!m)
	return NULL;
    m->trial = NTRIALS-1;
    m->next_trial = TRIAL_SPAN;
    m->method = RAW;
    m->strat = 0;
    m->revised_method = 0;

    return m;
}